

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s.c
# Opt level: O1

int blake2s_compress(hash_state *md,uchar *buf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  
  iVar1 = *(int *)buf;
  iVar2 = *(int *)(buf + 4);
  iVar3 = *(int *)(buf + 8);
  iVar4 = *(int *)(buf + 0xc);
  uVar35 = (md->blake2s).h[0] + (md->sha256).state[2] + iVar1;
  uVar29 = (md->sha256).state[6] ^ 0x510e527f ^ uVar35;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x10;
  uVar27 = uVar29 + 0x6a09e667 ^ (md->sha256).state[2];
  uVar27 = uVar27 >> 0xc | uVar27 << 0x14;
  uVar36 = uVar35 + iVar2 + uVar27;
  uVar35 = uVar36 ^ uVar29;
  uVar32 = uVar35 >> 8 | uVar35 << 0x18;
  uVar29 = uVar32 + 0x6a09e667 + uVar29;
  uVar27 = uVar27 ^ uVar29;
  uVar28 = uVar27 >> 7 | uVar27 << 0x19;
  uVar30 = (md->blake2s).h[1] + (md->sha256).state[3] + iVar3;
  uVar27 = (md->sha256).state[7] ^ 0x9b05688c ^ uVar30;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x10;
  uVar35 = uVar27 + 0xbb67ae85 ^ (md->sha256).state[3];
  uVar35 = uVar35 >> 0xc | uVar35 << 0x14;
  uVar21 = uVar30 + iVar4 + uVar35;
  uVar30 = uVar21 ^ uVar27;
  uVar22 = uVar30 >> 8 | uVar30 << 0x18;
  uVar27 = uVar22 + 0xbb67ae85 + uVar27;
  uVar35 = uVar35 ^ uVar27;
  uVar31 = uVar35 >> 7 | uVar35 << 0x19;
  iVar5 = *(int *)(buf + 0x10);
  uVar23 = (md->sha256).state[0] + (md->sha256).state[4] + iVar5;
  uVar35 = (md->sha256).curlen ^ 0x1f83d9ab ^ uVar23;
  uVar35 = uVar35 >> 0x10 | uVar35 << 0x10;
  uVar30 = uVar35 + 0x3c6ef372 ^ (md->sha256).state[4];
  uVar30 = uVar30 >> 0xc | uVar30 << 0x14;
  iVar6 = *(int *)(buf + 0x14);
  uVar24 = uVar23 + iVar6 + uVar30;
  uVar23 = uVar24 ^ uVar35;
  uVar37 = uVar23 >> 8 | uVar23 << 0x18;
  uVar35 = uVar37 + 0x3c6ef372 + uVar35;
  uVar30 = uVar30 ^ uVar35;
  uVar23 = uVar30 >> 7 | uVar30 << 0x19;
  iVar7 = *(int *)(buf + 0x18);
  uVar33 = (md->sha256).state[1] + (md->sha256).state[5] + iVar7;
  uVar30 = (md->blake2s).f[1] ^ 0x5be0cd19 ^ uVar33;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x10;
  uVar25 = uVar30 + 0xa54ff53a ^ (md->sha256).state[5];
  iVar8 = *(int *)(buf + 0x1c);
  iVar9 = *(int *)(buf + 0x20);
  iVar10 = *(int *)(buf + 0x24);
  iVar11 = *(int *)(buf + 0x28);
  iVar12 = *(int *)(buf + 0x2c);
  iVar13 = *(int *)(buf + 0x30);
  iVar14 = *(int *)(buf + 0x34);
  iVar15 = *(int *)(buf + 0x38);
  iVar16 = *(int *)(buf + 0x3c);
  uVar26 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar34 = uVar33 + iVar8 + uVar26;
  uVar25 = uVar34 ^ uVar30;
  uVar25 = uVar25 >> 8 | uVar25 << 0x18;
  uVar30 = uVar25 + 0xa54ff53a + uVar30;
  uVar26 = uVar26 ^ uVar30;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar33 = uVar36 + iVar9 + uVar31;
  uVar25 = uVar25 ^ uVar33;
  uVar25 = uVar25 >> 0x10 | uVar25 << 0x10;
  uVar35 = uVar35 + uVar25;
  uVar31 = uVar31 ^ uVar35;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar36 = uVar33 + iVar10 + uVar31;
  uVar25 = uVar25 ^ uVar36;
  uVar25 = uVar25 >> 8 | uVar25 << 0x18;
  uVar35 = uVar35 + uVar25;
  uVar31 = uVar31 ^ uVar35;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar21 = uVar21 + iVar11 + uVar23;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar30 = uVar30 + uVar32;
  uVar23 = uVar23 ^ uVar30;
  uVar23 = uVar23 >> 0xc | uVar23 << 0x14;
  uVar21 = uVar21 + iVar12 + uVar23;
  uVar32 = uVar32 ^ uVar21;
  uVar33 = uVar32 >> 8 | uVar32 << 0x18;
  uVar30 = uVar30 + uVar33;
  uVar23 = uVar23 ^ uVar30;
  uVar32 = uVar23 >> 7 | uVar23 << 0x19;
  uVar23 = uVar24 + iVar13 + uVar26;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar29 = uVar29 + uVar22;
  uVar26 = uVar26 ^ uVar29;
  uVar24 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar23 = uVar23 + iVar14 + uVar24;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar29 = uVar29 + uVar22;
  uVar24 = uVar24 ^ uVar29;
  uVar26 = uVar24 >> 7 | uVar24 << 0x19;
  uVar34 = uVar34 + iVar15 + uVar28;
  uVar37 = uVar37 ^ uVar34;
  uVar37 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar27 = uVar27 + uVar37;
  uVar28 = uVar28 ^ uVar27;
  uVar24 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar34 = uVar34 + iVar16 + uVar24;
  uVar37 = uVar37 ^ uVar34;
  uVar37 = uVar37 >> 8 | uVar37 << 0x18;
  uVar27 = uVar27 + uVar37;
  uVar24 = uVar24 ^ uVar27;
  uVar24 = uVar24 >> 7 | uVar24 << 0x19;
  uVar36 = uVar36 + iVar15 + uVar24;
  uVar33 = uVar33 ^ uVar36;
  uVar28 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar29 = uVar29 + uVar28;
  uVar24 = uVar24 ^ uVar29;
  uVar24 = uVar24 >> 0xc | uVar24 << 0x14;
  uVar36 = uVar36 + iVar11 + uVar24;
  uVar28 = uVar28 ^ uVar36;
  uVar33 = uVar28 >> 8 | uVar28 << 0x18;
  uVar29 = uVar29 + uVar33;
  uVar24 = uVar24 ^ uVar29;
  uVar28 = uVar24 >> 7 | uVar24 << 0x19;
  uVar21 = uVar21 + iVar5 + uVar31;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar27 = uVar27 + uVar22;
  uVar31 = uVar31 ^ uVar27;
  uVar24 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar21 = uVar21 + iVar9 + uVar24;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar27 = uVar27 + uVar22;
  uVar24 = uVar24 ^ uVar27;
  uVar31 = uVar24 >> 7 | uVar24 << 0x19;
  uVar23 = uVar23 + iVar10 + uVar32;
  uVar37 = uVar37 ^ uVar23;
  uVar37 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar35 = uVar35 + uVar37;
  uVar32 = uVar32 ^ uVar35;
  uVar24 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar23 = uVar23 + iVar16 + uVar24;
  uVar37 = uVar37 ^ uVar23;
  uVar37 = uVar37 >> 8 | uVar37 << 0x18;
  uVar35 = uVar35 + uVar37;
  uVar24 = uVar24 ^ uVar35;
  uVar32 = uVar24 >> 7 | uVar24 << 0x19;
  uVar34 = uVar34 + iVar14 + uVar26;
  uVar25 = uVar25 ^ uVar34;
  uVar24 = uVar25 >> 0x10 | uVar25 << 0x10;
  uVar30 = uVar30 + uVar24;
  uVar26 = uVar26 ^ uVar30;
  uVar25 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar34 = uVar34 + iVar7 + uVar25;
  uVar24 = uVar24 ^ uVar34;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar36 = uVar36 + iVar2 + uVar31;
  uVar24 = uVar24 ^ uVar36;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar35 = uVar35 + uVar24;
  uVar31 = uVar31 ^ uVar35;
  uVar26 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar36 = uVar36 + iVar13 + uVar26;
  uVar24 = uVar24 ^ uVar36;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar35 = uVar35 + uVar24;
  uVar26 = uVar26 ^ uVar35;
  uVar31 = uVar26 >> 7 | uVar26 << 0x19;
  uVar21 = uVar21 + iVar1 + uVar32;
  uVar33 = uVar33 ^ uVar21;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar30 = uVar30 + uVar33;
  uVar32 = uVar32 ^ uVar30;
  uVar26 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar21 = uVar21 + iVar3 + uVar26;
  uVar33 = uVar33 ^ uVar21;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar30 = uVar30 + uVar33;
  uVar26 = uVar26 ^ uVar30;
  uVar32 = uVar26 >> 7 | uVar26 << 0x19;
  uVar23 = uVar23 + iVar12 + uVar25;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar29 = uVar29 + uVar22;
  uVar25 = uVar25 ^ uVar29;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar23 = uVar23 + iVar8 + uVar25;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar29 = uVar29 + uVar22;
  uVar25 = uVar25 ^ uVar29;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar34 = uVar34 + iVar6 + uVar28;
  uVar37 = uVar37 ^ uVar34;
  uVar37 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar27 = uVar27 + uVar37;
  uVar28 = uVar28 ^ uVar27;
  uVar26 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar34 = uVar34 + iVar4 + uVar26;
  uVar37 = uVar37 ^ uVar34;
  uVar37 = uVar37 >> 8 | uVar37 << 0x18;
  uVar27 = uVar27 + uVar37;
  uVar26 = uVar26 ^ uVar27;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar36 = uVar36 + iVar12 + uVar26;
  uVar33 = uVar33 ^ uVar36;
  uVar28 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar29 = uVar29 + uVar28;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar36 = uVar36 + iVar9 + uVar26;
  uVar28 = uVar28 ^ uVar36;
  uVar33 = uVar28 >> 8 | uVar28 << 0x18;
  uVar29 = uVar29 + uVar33;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar21 = uVar21 + iVar13 + uVar31;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar27 = uVar27 + uVar22;
  uVar31 = uVar31 ^ uVar27;
  uVar28 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar21 = uVar21 + iVar1 + uVar28;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar27 = uVar27 + uVar22;
  uVar28 = uVar28 ^ uVar27;
  uVar28 = uVar28 >> 7 | uVar28 << 0x19;
  uVar23 = uVar23 + iVar6 + uVar32;
  uVar37 = uVar37 ^ uVar23;
  uVar37 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar35 = uVar35 + uVar37;
  uVar32 = uVar32 ^ uVar35;
  uVar31 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar23 = uVar23 + iVar3 + uVar31;
  uVar37 = uVar37 ^ uVar23;
  uVar37 = uVar37 >> 8 | uVar37 << 0x18;
  uVar35 = uVar35 + uVar37;
  uVar31 = uVar31 ^ uVar35;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar32 = uVar34 + iVar16 + uVar25;
  uVar24 = uVar24 ^ uVar32;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar34 = uVar32 + iVar14 + uVar25;
  uVar24 = uVar24 ^ uVar34;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar32 = uVar36 + iVar11 + uVar28;
  uVar24 = uVar24 ^ uVar32;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar35 = uVar35 + uVar24;
  uVar28 = uVar28 ^ uVar35;
  uVar28 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar36 = uVar32 + iVar15 + uVar28;
  uVar24 = uVar24 ^ uVar36;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar35 = uVar35 + uVar24;
  uVar28 = uVar28 ^ uVar35;
  uVar28 = uVar28 >> 7 | uVar28 << 0x19;
  uVar21 = uVar21 + iVar4 + uVar31;
  uVar33 = uVar33 ^ uVar21;
  uVar32 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar30 = uVar30 + uVar32;
  uVar31 = uVar31 ^ uVar30;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar21 = uVar21 + iVar7 + uVar31;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar30 = uVar30 + uVar32;
  uVar31 = uVar31 ^ uVar30;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar23 = uVar23 + iVar8 + uVar25;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar29 = uVar29 + uVar22;
  uVar25 = uVar25 ^ uVar29;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar23 = uVar23 + iVar2 + uVar25;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar29 = uVar29 + uVar22;
  uVar25 = uVar25 ^ uVar29;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar34 + iVar10 + uVar26;
  uVar37 = uVar37 ^ uVar33;
  uVar34 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar27 = uVar27 + uVar34;
  uVar26 = uVar26 ^ uVar27;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar33 = uVar33 + iVar5 + uVar26;
  uVar34 = uVar34 ^ uVar33;
  uVar37 = uVar34 >> 8 | uVar34 << 0x18;
  uVar27 = uVar27 + uVar37;
  uVar26 = uVar26 ^ uVar27;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar34 = uVar36 + iVar8 + uVar26;
  uVar32 = uVar32 ^ uVar34;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar29 = uVar29 + uVar32;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar34 = uVar34 + iVar10 + uVar26;
  uVar32 = uVar32 ^ uVar34;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar29 = uVar29 + uVar32;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar21 = uVar21 + iVar4 + uVar28;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar27 = uVar27 + uVar22;
  uVar28 = uVar28 ^ uVar27;
  uVar28 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar21 = uVar21 + iVar2 + uVar28;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar27 = uVar27 + uVar22;
  uVar28 = uVar28 ^ uVar27;
  uVar28 = uVar28 >> 7 | uVar28 << 0x19;
  uVar23 = uVar23 + iVar14 + uVar31;
  uVar37 = uVar37 ^ uVar23;
  uVar36 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar35 = uVar35 + uVar36;
  uVar31 = uVar31 ^ uVar35;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar23 = uVar23 + iVar13 + uVar31;
  uVar36 = uVar36 ^ uVar23;
  uVar37 = uVar36 >> 8 | uVar36 << 0x18;
  uVar35 = uVar35 + uVar37;
  uVar31 = uVar31 ^ uVar35;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar33 = uVar33 + iVar12 + uVar25;
  uVar24 = uVar24 ^ uVar33;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar33 = uVar33 + iVar15 + uVar25;
  uVar24 = uVar24 ^ uVar33;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar34 = uVar34 + iVar3 + uVar28;
  uVar24 = uVar24 ^ uVar34;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar35 = uVar35 + uVar24;
  uVar28 = uVar28 ^ uVar35;
  uVar28 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar36 = uVar34 + iVar7 + uVar28;
  uVar24 = uVar24 ^ uVar36;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar35 = uVar35 + uVar24;
  uVar28 = uVar28 ^ uVar35;
  uVar28 = uVar28 >> 7 | uVar28 << 0x19;
  uVar21 = uVar21 + iVar6 + uVar31;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar30 = uVar30 + uVar32;
  uVar31 = uVar31 ^ uVar30;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar21 = uVar21 + iVar11 + uVar31;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar30 = uVar30 + uVar32;
  uVar31 = uVar31 ^ uVar30;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar23 = uVar23 + iVar5 + uVar25;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar29 = uVar29 + uVar22;
  uVar25 = uVar25 ^ uVar29;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar23 = uVar23 + iVar1 + uVar25;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar29 = uVar29 + uVar22;
  uVar25 = uVar25 ^ uVar29;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar33 = uVar33 + iVar16 + uVar26;
  uVar37 = uVar37 ^ uVar33;
  uVar37 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar27 = uVar27 + uVar37;
  uVar26 = uVar26 ^ uVar27;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar34 = uVar33 + iVar9 + uVar26;
  uVar37 = uVar37 ^ uVar34;
  uVar37 = uVar37 >> 8 | uVar37 << 0x18;
  uVar27 = uVar27 + uVar37;
  uVar26 = uVar26 ^ uVar27;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar33 = uVar36 + iVar10 + uVar26;
  uVar32 = uVar32 ^ uVar33;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar29 = uVar29 + uVar32;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar36 = uVar33 + iVar1 + uVar26;
  uVar32 = uVar32 ^ uVar36;
  uVar33 = uVar32 >> 8 | uVar32 << 0x18;
  uVar29 = uVar29 + uVar33;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar21 = uVar21 + iVar6 + uVar28;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar27 = uVar27 + uVar22;
  uVar28 = uVar28 ^ uVar27;
  uVar28 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar21 = uVar21 + iVar8 + uVar28;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar27 = uVar27 + uVar22;
  uVar28 = uVar28 ^ uVar27;
  uVar28 = uVar28 >> 7 | uVar28 << 0x19;
  uVar23 = uVar23 + iVar3 + uVar31;
  uVar37 = uVar37 ^ uVar23;
  uVar32 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar35 = uVar35 + uVar32;
  uVar31 = uVar31 ^ uVar35;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar23 = uVar23 + iVar5 + uVar31;
  uVar32 = uVar32 ^ uVar23;
  uVar37 = uVar32 >> 8 | uVar32 << 0x18;
  uVar35 = uVar35 + uVar37;
  uVar31 = uVar31 ^ uVar35;
  uVar32 = uVar31 >> 7 | uVar31 << 0x19;
  uVar31 = uVar34 + iVar11 + uVar25;
  uVar24 = uVar24 ^ uVar31;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar34 = uVar31 + iVar16 + uVar25;
  uVar24 = uVar24 ^ uVar34;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar31 = uVar36 + iVar15 + uVar28;
  uVar24 = uVar24 ^ uVar31;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar35 = uVar35 + uVar24;
  uVar28 = uVar28 ^ uVar35;
  uVar28 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar36 = uVar31 + iVar2 + uVar28;
  uVar24 = uVar24 ^ uVar36;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar35 = uVar35 + uVar24;
  uVar28 = uVar28 ^ uVar35;
  uVar31 = uVar28 >> 7 | uVar28 << 0x19;
  uVar21 = uVar21 + iVar12 + uVar32;
  uVar33 = uVar33 ^ uVar21;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar30 = uVar30 + uVar33;
  uVar32 = uVar32 ^ uVar30;
  uVar28 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar21 = uVar21 + iVar13 + uVar28;
  uVar33 = uVar33 ^ uVar21;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar30 = uVar30 + uVar33;
  uVar28 = uVar28 ^ uVar30;
  uVar32 = uVar28 >> 7 | uVar28 << 0x19;
  uVar23 = uVar23 + iVar7 + uVar25;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar29 = uVar29 + uVar22;
  uVar25 = uVar25 ^ uVar29;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar23 = uVar23 + iVar9 + uVar25;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar29 = uVar29 + uVar22;
  uVar25 = uVar25 ^ uVar29;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar28 = uVar34 + iVar4 + uVar26;
  uVar37 = uVar37 ^ uVar28;
  uVar37 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar27 = uVar27 + uVar37;
  uVar26 = uVar26 ^ uVar27;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar34 = uVar28 + iVar14 + uVar26;
  uVar37 = uVar37 ^ uVar34;
  uVar37 = uVar37 >> 8 | uVar37 << 0x18;
  uVar27 = uVar27 + uVar37;
  uVar26 = uVar26 ^ uVar27;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar36 = uVar36 + iVar3 + uVar26;
  uVar33 = uVar33 ^ uVar36;
  uVar28 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar29 = uVar29 + uVar28;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar36 = uVar36 + iVar13 + uVar26;
  uVar28 = uVar28 ^ uVar36;
  uVar33 = uVar28 >> 8 | uVar28 << 0x18;
  uVar29 = uVar29 + uVar33;
  uVar26 = uVar26 ^ uVar29;
  uVar28 = uVar26 >> 7 | uVar26 << 0x19;
  uVar21 = uVar21 + iVar7 + uVar31;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar27 = uVar27 + uVar22;
  uVar31 = uVar31 ^ uVar27;
  uVar26 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar21 = uVar21 + iVar11 + uVar26;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar27 = uVar27 + uVar22;
  uVar26 = uVar26 ^ uVar27;
  uVar31 = uVar26 >> 7 | uVar26 << 0x19;
  uVar23 = uVar23 + iVar1 + uVar32;
  uVar37 = uVar37 ^ uVar23;
  uVar37 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar35 = uVar35 + uVar37;
  uVar32 = uVar32 ^ uVar35;
  uVar26 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar23 = uVar23 + iVar12 + uVar26;
  uVar37 = uVar37 ^ uVar23;
  uVar38 = uVar37 >> 8 | uVar37 << 0x18;
  uVar35 = uVar35 + uVar38;
  uVar26 = uVar26 ^ uVar35;
  uVar32 = uVar26 >> 7 | uVar26 << 0x19;
  uVar26 = uVar34 + iVar9 + uVar25;
  uVar24 = uVar24 ^ uVar26;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar34 = uVar26 + iVar4 + uVar25;
  uVar24 = uVar24 ^ uVar34;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar26 = uVar25 >> 7 | uVar25 << 0x19;
  uVar25 = uVar36 + iVar5 + uVar31;
  uVar24 = uVar24 ^ uVar25;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar35 = uVar35 + uVar24;
  uVar31 = uVar31 ^ uVar35;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar37 = uVar25 + iVar14 + uVar31;
  uVar24 = uVar24 ^ uVar37;
  uVar25 = uVar24 >> 8 | uVar24 << 0x18;
  uVar35 = uVar35 + uVar25;
  uVar31 = uVar31 ^ uVar35;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar21 = uVar21 + iVar8 + uVar32;
  uVar33 = uVar33 ^ uVar21;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar30 = uVar30 + uVar33;
  uVar32 = uVar32 ^ uVar30;
  uVar24 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar21 = uVar21 + iVar6 + uVar24;
  uVar33 = uVar33 ^ uVar21;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar30 = uVar30 + uVar33;
  uVar24 = uVar24 ^ uVar30;
  uVar32 = uVar24 >> 7 | uVar24 << 0x19;
  uVar23 = uVar23 + iVar16 + uVar26;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar29 = uVar29 + uVar22;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar24 = uVar23 + iVar15 + uVar26;
  uVar22 = uVar22 ^ uVar24;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar29 = uVar29 + uVar22;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar34 = uVar34 + iVar2 + uVar28;
  uVar38 = uVar38 ^ uVar34;
  uVar38 = uVar38 >> 0x10 | uVar38 << 0x10;
  uVar27 = uVar27 + uVar38;
  uVar28 = uVar28 ^ uVar27;
  uVar23 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar36 = uVar34 + iVar10 + uVar23;
  uVar38 = uVar38 ^ uVar36;
  uVar38 = uVar38 >> 8 | uVar38 << 0x18;
  uVar27 = uVar27 + uVar38;
  uVar23 = uVar23 ^ uVar27;
  uVar23 = uVar23 >> 7 | uVar23 << 0x19;
  uVar34 = uVar37 + iVar13 + uVar23;
  uVar33 = uVar33 ^ uVar34;
  uVar28 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar29 = uVar29 + uVar28;
  uVar23 = uVar23 ^ uVar29;
  uVar23 = uVar23 >> 0xc | uVar23 << 0x14;
  uVar37 = uVar34 + iVar6 + uVar23;
  uVar28 = uVar28 ^ uVar37;
  uVar34 = uVar28 >> 8 | uVar28 << 0x18;
  uVar29 = uVar29 + uVar34;
  uVar23 = uVar23 ^ uVar29;
  uVar28 = uVar23 >> 7 | uVar23 << 0x19;
  uVar21 = uVar21 + iVar2 + uVar31;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar27 = uVar27 + uVar22;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar23 = uVar21 + iVar16 + uVar31;
  uVar22 = uVar22 ^ uVar23;
  uVar21 = uVar22 >> 8 | uVar22 << 0x18;
  uVar27 = uVar27 + uVar21;
  uVar31 = uVar31 ^ uVar27;
  uVar31 = uVar31 >> 7 | uVar31 << 0x19;
  uVar22 = uVar24 + iVar15 + uVar32;
  uVar38 = uVar38 ^ uVar22;
  uVar33 = uVar38 >> 0x10 | uVar38 << 0x10;
  uVar35 = uVar35 + uVar33;
  uVar32 = uVar32 ^ uVar35;
  uVar32 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar24 = uVar22 + iVar14 + uVar32;
  uVar33 = uVar33 ^ uVar24;
  uVar38 = uVar33 >> 8 | uVar33 << 0x18;
  uVar35 = uVar35 + uVar38;
  uVar32 = uVar32 ^ uVar35;
  uVar33 = uVar32 >> 7 | uVar32 << 0x19;
  uVar32 = uVar36 + iVar5 + uVar26;
  uVar25 = uVar25 ^ uVar32;
  uVar22 = uVar25 >> 0x10 | uVar25 << 0x10;
  uVar30 = uVar30 + uVar22;
  uVar26 = uVar26 ^ uVar30;
  uVar25 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar36 = uVar32 + iVar11 + uVar25;
  uVar22 = uVar22 ^ uVar36;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar30 = uVar30 + uVar22;
  uVar25 = uVar25 ^ uVar30;
  uVar26 = uVar25 >> 7 | uVar25 << 0x19;
  uVar25 = uVar37 + iVar1 + uVar31;
  uVar22 = uVar22 ^ uVar25;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar35 = uVar35 + uVar22;
  uVar31 = uVar31 ^ uVar35;
  uVar31 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar37 = uVar25 + iVar8 + uVar31;
  uVar22 = uVar22 ^ uVar37;
  uVar25 = uVar22 >> 8 | uVar22 << 0x18;
  uVar35 = uVar35 + uVar25;
  uVar31 = uVar31 ^ uVar35;
  uVar32 = uVar31 >> 7 | uVar31 << 0x19;
  uVar22 = uVar23 + iVar7 + uVar33;
  uVar34 = uVar34 ^ uVar22;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar34;
  uVar33 = uVar33 ^ uVar30;
  uVar31 = uVar33 >> 0xc | uVar33 << 0x14;
  uVar23 = uVar22 + iVar4 + uVar31;
  uVar34 = uVar34 ^ uVar23;
  uVar34 = uVar34 >> 8 | uVar34 << 0x18;
  uVar30 = uVar30 + uVar34;
  uVar31 = uVar31 ^ uVar30;
  uVar33 = uVar31 >> 7 | uVar31 << 0x19;
  uVar22 = uVar24 + iVar10 + uVar26;
  uVar21 = uVar21 ^ uVar22;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x10;
  uVar29 = uVar29 + uVar21;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar24 = uVar22 + iVar3 + uVar26;
  uVar21 = uVar21 ^ uVar24;
  uVar22 = uVar21 >> 8 | uVar21 << 0x18;
  uVar29 = uVar29 + uVar22;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar31 = uVar36 + iVar9 + uVar28;
  uVar38 = uVar38 ^ uVar31;
  uVar38 = uVar38 >> 0x10 | uVar38 << 0x10;
  uVar27 = uVar27 + uVar38;
  uVar28 = uVar28 ^ uVar27;
  uVar21 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar36 = uVar31 + iVar12 + uVar21;
  uVar38 = uVar38 ^ uVar36;
  uVar38 = uVar38 >> 8 | uVar38 << 0x18;
  uVar27 = uVar27 + uVar38;
  uVar21 = uVar21 ^ uVar27;
  uVar21 = uVar21 >> 7 | uVar21 << 0x19;
  uVar31 = uVar37 + iVar14 + uVar21;
  uVar34 = uVar34 ^ uVar31;
  uVar28 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar29 = uVar29 + uVar28;
  uVar21 = uVar21 ^ uVar29;
  uVar21 = uVar21 >> 0xc | uVar21 << 0x14;
  uVar37 = uVar31 + iVar12 + uVar21;
  uVar28 = uVar28 ^ uVar37;
  uVar34 = uVar28 >> 8 | uVar28 << 0x18;
  uVar29 = uVar29 + uVar34;
  uVar21 = uVar21 ^ uVar29;
  uVar31 = uVar21 >> 7 | uVar21 << 0x19;
  uVar21 = uVar23 + iVar8 + uVar32;
  uVar22 = uVar22 ^ uVar21;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar27 = uVar27 + uVar22;
  uVar32 = uVar32 ^ uVar27;
  uVar28 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar21 = uVar21 + iVar15 + uVar28;
  uVar22 = uVar22 ^ uVar21;
  uVar23 = uVar22 >> 8 | uVar22 << 0x18;
  uVar27 = uVar27 + uVar23;
  uVar28 = uVar28 ^ uVar27;
  uVar32 = uVar28 >> 7 | uVar28 << 0x19;
  uVar22 = uVar24 + iVar13 + uVar33;
  uVar38 = uVar38 ^ uVar22;
  uVar38 = uVar38 >> 0x10 | uVar38 << 0x10;
  uVar35 = uVar35 + uVar38;
  uVar33 = uVar33 ^ uVar35;
  uVar28 = uVar33 >> 0xc | uVar33 << 0x14;
  uVar24 = uVar22 + iVar2 + uVar28;
  uVar38 = uVar38 ^ uVar24;
  uVar38 = uVar38 >> 8 | uVar38 << 0x18;
  uVar35 = uVar35 + uVar38;
  uVar28 = uVar28 ^ uVar35;
  uVar22 = uVar28 >> 7 | uVar28 << 0x19;
  uVar28 = uVar36 + iVar4 + uVar26;
  uVar25 = uVar25 ^ uVar28;
  uVar25 = uVar25 >> 0x10 | uVar25 << 0x10;
  uVar30 = uVar30 + uVar25;
  uVar26 = uVar26 ^ uVar30;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar36 = uVar28 + iVar10 + uVar26;
  uVar25 = uVar25 ^ uVar36;
  uVar25 = uVar25 >> 8 | uVar25 << 0x18;
  uVar30 = uVar30 + uVar25;
  uVar26 = uVar26 ^ uVar30;
  uVar28 = uVar26 >> 7 | uVar26 << 0x19;
  uVar26 = uVar37 + iVar6 + uVar32;
  uVar25 = uVar25 ^ uVar26;
  uVar25 = uVar25 >> 0x10 | uVar25 << 0x10;
  uVar35 = uVar35 + uVar25;
  uVar32 = uVar32 ^ uVar35;
  uVar32 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar37 = uVar26 + iVar1 + uVar32;
  uVar25 = uVar25 ^ uVar37;
  uVar26 = uVar25 >> 8 | uVar25 << 0x18;
  uVar35 = uVar35 + uVar26;
  uVar32 = uVar32 ^ uVar35;
  uVar33 = uVar32 >> 7 | uVar32 << 0x19;
  uVar25 = uVar21 + iVar16 + uVar22;
  uVar34 = uVar34 ^ uVar25;
  uVar32 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar30 = uVar30 + uVar32;
  uVar22 = uVar22 ^ uVar30;
  uVar21 = uVar22 >> 0xc | uVar22 << 0x14;
  uVar34 = uVar25 + iVar5 + uVar21;
  uVar32 = uVar32 ^ uVar34;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar30 = uVar30 + uVar32;
  uVar21 = uVar21 ^ uVar30;
  uVar21 = uVar21 >> 7 | uVar21 << 0x19;
  uVar24 = uVar24 + iVar9 + uVar28;
  uVar23 = uVar23 ^ uVar24;
  uVar22 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar29 = uVar29 + uVar22;
  uVar28 = uVar28 ^ uVar29;
  uVar28 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar25 = uVar24 + iVar7 + uVar28;
  uVar22 = uVar22 ^ uVar25;
  uVar23 = uVar22 >> 8 | uVar22 << 0x18;
  uVar29 = uVar29 + uVar23;
  uVar28 = uVar28 ^ uVar29;
  uVar28 = uVar28 >> 7 | uVar28 << 0x19;
  uVar24 = uVar36 + iVar3 + uVar31;
  uVar38 = uVar38 ^ uVar24;
  uVar38 = uVar38 >> 0x10 | uVar38 << 0x10;
  uVar27 = uVar27 + uVar38;
  uVar31 = uVar31 ^ uVar27;
  uVar22 = uVar31 >> 0xc | uVar31 << 0x14;
  uVar36 = uVar24 + iVar11 + uVar22;
  uVar38 = uVar38 ^ uVar36;
  uVar38 = uVar38 >> 8 | uVar38 << 0x18;
  uVar27 = uVar27 + uVar38;
  uVar22 = uVar22 ^ uVar27;
  uVar24 = uVar22 >> 7 | uVar22 << 0x19;
  uVar31 = uVar37 + iVar7 + uVar24;
  uVar32 = uVar32 ^ uVar31;
  uVar22 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar29 = uVar29 + uVar22;
  uVar24 = uVar24 ^ uVar29;
  uVar24 = uVar24 >> 0xc | uVar24 << 0x14;
  uVar37 = uVar31 + iVar16 + uVar24;
  uVar22 = uVar22 ^ uVar37;
  uVar31 = uVar22 >> 8 | uVar22 << 0x18;
  uVar29 = uVar29 + uVar31;
  uVar24 = uVar24 ^ uVar29;
  uVar22 = uVar24 >> 7 | uVar24 << 0x19;
  uVar32 = uVar34 + iVar15 + uVar33;
  uVar23 = uVar23 ^ uVar32;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar27 = uVar27 + uVar23;
  uVar33 = uVar33 ^ uVar27;
  uVar24 = uVar33 >> 0xc | uVar33 << 0x14;
  uVar33 = uVar32 + iVar10 + uVar24;
  uVar23 = uVar23 ^ uVar33;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar27 = uVar27 + uVar23;
  uVar24 = uVar24 ^ uVar27;
  uVar24 = uVar24 >> 7 | uVar24 << 0x19;
  uVar25 = uVar25 + iVar12 + uVar21;
  uVar38 = uVar38 ^ uVar25;
  uVar32 = uVar38 >> 0x10 | uVar38 << 0x10;
  uVar35 = uVar35 + uVar32;
  uVar21 = uVar21 ^ uVar35;
  uVar21 = uVar21 >> 0xc | uVar21 << 0x14;
  uVar25 = uVar25 + iVar4 + uVar21;
  uVar32 = uVar32 ^ uVar25;
  uVar34 = uVar32 >> 8 | uVar32 << 0x18;
  uVar35 = uVar35 + uVar34;
  uVar21 = uVar21 ^ uVar35;
  uVar21 = uVar21 >> 7 | uVar21 << 0x19;
  uVar32 = uVar36 + iVar1 + uVar28;
  uVar26 = uVar26 ^ uVar32;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x10;
  uVar30 = uVar30 + uVar26;
  uVar28 = uVar28 ^ uVar30;
  uVar28 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar36 = uVar32 + iVar9 + uVar28;
  uVar26 = uVar26 ^ uVar36;
  uVar26 = uVar26 >> 8 | uVar26 << 0x18;
  uVar30 = uVar30 + uVar26;
  uVar28 = uVar28 ^ uVar30;
  uVar28 = uVar28 >> 7 | uVar28 << 0x19;
  uVar32 = uVar37 + iVar13 + uVar24;
  uVar26 = uVar26 ^ uVar32;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x10;
  uVar35 = uVar35 + uVar26;
  uVar24 = uVar24 ^ uVar35;
  uVar24 = uVar24 >> 0xc | uVar24 << 0x14;
  uVar32 = uVar32 + iVar3 + uVar24;
  uVar26 = uVar26 ^ uVar32;
  uVar26 = uVar26 >> 8 | uVar26 << 0x18;
  uVar35 = uVar35 + uVar26;
  uVar24 = uVar24 ^ uVar35;
  uVar24 = uVar24 >> 7 | uVar24 << 0x19;
  uVar33 = uVar33 + iVar14 + uVar21;
  uVar31 = uVar31 ^ uVar33;
  uVar37 = uVar31 >> 0x10 | uVar31 << 0x10;
  uVar30 = uVar30 + uVar37;
  uVar21 = uVar21 ^ uVar30;
  uVar21 = uVar21 >> 0xc | uVar21 << 0x14;
  uVar31 = uVar33 + iVar8 + uVar21;
  uVar37 = uVar37 ^ uVar31;
  uVar37 = uVar37 >> 8 | uVar37 << 0x18;
  uVar30 = uVar30 + uVar37;
  uVar21 = uVar21 ^ uVar30;
  uVar21 = uVar21 >> 7 | uVar21 << 0x19;
  uVar33 = uVar25 + iVar2 + uVar28;
  uVar23 = uVar23 ^ uVar33;
  uVar25 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar29 = uVar29 + uVar25;
  uVar28 = uVar28 ^ uVar29;
  uVar23 = uVar28 >> 0xc | uVar28 << 0x14;
  uVar38 = uVar33 + iVar5 + uVar23;
  uVar25 = uVar25 ^ uVar38;
  uVar33 = uVar25 >> 8 | uVar25 << 0x18;
  uVar29 = uVar29 + uVar33;
  uVar23 = uVar23 ^ uVar29;
  uVar25 = uVar23 >> 7 | uVar23 << 0x19;
  uVar28 = uVar36 + iVar11 + uVar22;
  uVar34 = uVar34 ^ uVar28;
  uVar23 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar27 = uVar27 + uVar23;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0xc | uVar22 << 0x14;
  uVar28 = uVar28 + iVar6 + uVar22;
  uVar23 = uVar23 ^ uVar28;
  uVar34 = uVar23 >> 8 | uVar23 << 0x18;
  uVar27 = uVar27 + uVar34;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 7 | uVar22 << 0x19;
  uVar23 = uVar32 + iVar11 + uVar22;
  uVar37 = uVar37 ^ uVar23;
  uVar31 = uVar31 + iVar9 + uVar24;
  uVar33 = uVar33 ^ uVar31;
  uVar38 = uVar38 + iVar8 + uVar21;
  uVar34 = uVar34 ^ uVar38;
  uVar36 = uVar28 + iVar2 + uVar25;
  uVar26 = uVar26 ^ uVar36;
  uVar32 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar29 = uVar29 + uVar32;
  uVar22 = uVar22 ^ uVar29;
  uVar22 = uVar22 >> 0xc | uVar22 << 0x14;
  uVar28 = uVar23 + iVar3 + uVar22;
  uVar32 = uVar32 ^ uVar28;
  uVar37 = uVar32 >> 8 | uVar32 << 0x18;
  uVar29 = uVar29 + uVar37;
  uVar22 = uVar22 ^ uVar29;
  uVar22 = uVar22 >> 7 | uVar22 << 0x19;
  uVar32 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar27 = uVar27 + uVar32;
  uVar24 = uVar24 ^ uVar27;
  uVar23 = uVar24 >> 0xc | uVar24 << 0x14;
  uVar31 = uVar31 + iVar5 + uVar23;
  uVar32 = uVar32 ^ uVar31;
  uVar32 = uVar32 >> 8 | uVar32 << 0x18;
  uVar27 = uVar27 + uVar32;
  uVar23 = uVar23 ^ uVar27;
  uVar23 = uVar23 >> 7 | uVar23 << 0x19;
  uVar24 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar35 = uVar35 + uVar24;
  uVar21 = uVar21 ^ uVar35;
  uVar21 = uVar21 >> 0xc | uVar21 << 0x14;
  uVar38 = uVar38 + iVar7 + uVar21;
  uVar24 = uVar24 ^ uVar38;
  uVar33 = uVar24 >> 8 | uVar24 << 0x18;
  uVar35 = uVar35 + uVar33;
  uVar21 = uVar21 ^ uVar35;
  uVar21 = uVar21 >> 7 | uVar21 << 0x19;
  uVar24 = uVar26 >> 0x10 | uVar26 << 0x10;
  uVar30 = uVar30 + uVar24;
  uVar25 = uVar25 ^ uVar30;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar34 = uVar36 + iVar6 + uVar25;
  uVar24 = uVar24 ^ uVar34;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar30 = uVar30 + uVar24;
  uVar28 = uVar28 + iVar16 + uVar23;
  uVar24 = uVar24 ^ uVar28;
  uVar31 = uVar31 + iVar10 + uVar21;
  uVar37 = uVar37 ^ uVar31;
  uVar25 = uVar25 ^ uVar30;
  uVar26 = uVar25 >> 7 | uVar25 << 0x19;
  uVar38 = uVar38 + iVar4 + uVar26;
  uVar32 = uVar32 ^ uVar38;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar35 = uVar35 + uVar24;
  uVar23 = uVar23 ^ uVar35;
  uVar23 = uVar23 >> 0xc | uVar23 << 0x14;
  uVar28 = uVar28 + iVar12 + uVar23;
  uVar24 = uVar24 ^ uVar28;
  uVar25 = uVar24 >> 8 | uVar24 << 0x18;
  uVar35 = uVar35 + uVar25;
  uVar23 = uVar23 ^ uVar35;
  uVar36 = uVar37 >> 0x10 | uVar37 << 0x10;
  uVar30 = uVar30 + uVar36;
  uVar21 = uVar21 ^ uVar30;
  uVar24 = uVar21 >> 0xc | uVar21 << 0x14;
  uVar31 = uVar31 + iVar15 + uVar24;
  uVar36 = uVar36 ^ uVar31;
  uVar36 = uVar36 >> 8 | uVar36 << 0x18;
  uVar30 = uVar30 + uVar36;
  uVar24 = uVar24 ^ uVar30;
  uVar21 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar29 = uVar29 + uVar21;
  uVar26 = uVar26 ^ uVar29;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar37 = uVar38 + iVar13 + uVar26;
  uVar21 = uVar21 ^ uVar37;
  uVar21 = uVar21 >> 8 | uVar21 << 0x18;
  uVar29 = uVar29 + uVar21;
  auVar17 = vpinsrd_avx(ZEXT416(uVar36),uVar21,1);
  uVar34 = uVar34 + iVar14 + uVar22;
  uVar33 = uVar33 ^ uVar34;
  uVar26 = uVar26 ^ uVar29;
  uVar32 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar27 = uVar27 + uVar32;
  uVar22 = uVar22 ^ uVar27;
  uVar21 = uVar22 >> 0xc | uVar22 << 0x14;
  uVar33 = uVar34 + iVar1 + uVar21;
  uVar32 = uVar32 ^ uVar33;
  uVar22 = uVar32 >> 8 | uVar32 << 0x18;
  auVar17 = vpinsrd_avx(auVar17,uVar22,2);
  auVar17 = vpinsrd_avx(auVar17,uVar25,3);
  uVar27 = uVar27 + uVar22;
  auVar18 = vpinsrd_avx(ZEXT416(uVar29),uVar27,1);
  auVar18 = vpinsrd_avx(auVar18,uVar35,2);
  auVar18 = vpinsrd_avx(auVar18,uVar30,3);
  auVar19 = vpinsrd_avx(ZEXT416(uVar28),uVar31,1);
  uVar27 = uVar27 ^ uVar21;
  auVar19 = vpinsrd_avx(auVar19,uVar37,2);
  auVar19 = vpinsrd_avx(auVar19,uVar33,3);
  auVar20 = vpinsrd_avx(ZEXT416(uVar27 >> 7 | uVar27 << 0x19),uVar23 >> 7 | uVar23 << 0x19,1);
  auVar20 = vpinsrd_avx(auVar20,uVar24 >> 7 | uVar24 << 0x19,2);
  auVar20 = vpinsrd_avx(auVar20,uVar26 >> 7 | uVar26 << 0x19,3);
  auVar39._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar18;
  auVar39._16_16_ = ZEXT116(1) * auVar17;
  auVar40._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar19;
  auVar40._16_16_ = ZEXT116(1) * auVar20;
  auVar39 = vpternlogd_avx512vl(auVar40,auVar39,*(undefined1 (*) [32])(md->blake2s).h,0x96);
  *(undefined1 (*) [32])(md->blake2s).h = auVar39;
  return (int)md;
}

Assistant:

static int blake2s_compress(hash_state *md, const unsigned char *buf)
#endif
{
   unsigned long i;
   ulong32 m[16];
   ulong32 v[16];

   for (i = 0; i < 16; ++i) {
      LOAD32L(m[i], buf + i * sizeof(m[i]));
   }

   for (i = 0; i < 8; ++i)
      v[i] = md->blake2s.h[i];

   v[8] = blake2s_IV[0];
   v[9] = blake2s_IV[1];
   v[10] = blake2s_IV[2];
   v[11] = blake2s_IV[3];
   v[12] = md->blake2s.t[0] ^ blake2s_IV[4];
   v[13] = md->blake2s.t[1] ^ blake2s_IV[5];
   v[14] = md->blake2s.f[0] ^ blake2s_IV[6];
   v[15] = md->blake2s.f[1] ^ blake2s_IV[7];

   ROUND(0);
   ROUND(1);
   ROUND(2);
   ROUND(3);
   ROUND(4);
   ROUND(5);
   ROUND(6);
   ROUND(7);
   ROUND(8);
   ROUND(9);

   for (i = 0; i < 8; ++i)
      md->blake2s.h[i] = md->blake2s.h[i] ^ v[i] ^ v[i + 8];

   return CRYPT_OK;
}